

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  u32 *puVar1;
  byte bVar2;
  char cVar3;
  u16 uVar4;
  i16 iVar5;
  int iVar6;
  int iVar7;
  Parse *pParse;
  sqlite3 *db;
  WhereMaskSet *pMaskSet;
  Expr *pEVar8;
  sqlite3 *db_00;
  ExprList_item *pEVar9;
  Vdbe *pVVar10;
  Table *pTVar11;
  bool bVar12;
  char cVar13;
  u8 uVar14;
  char cVar15;
  char cVar16;
  byte bVar17;
  short sVar18;
  short sVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  Bitmask BVar26;
  char *pcVar27;
  ExprList *pEVar28;
  Expr *pEVar29;
  Expr *pEVar30;
  WhereClause *pWC_00;
  WhereOrInfo *pWC_01;
  CollSeq *pCVar31;
  char *pcVar32;
  FuncDef *pFVar33;
  sqlite3_value *pVal;
  byte *pbVar34;
  Expr *pEVar35;
  Expr *pEVar36;
  long lVar37;
  byte *pbVar38;
  u8 aff;
  ushort uVar39;
  int idxTerm_00;
  int idxTerm_01;
  int idxTerm_02;
  int idxTerm_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar40;
  undefined8 extraout_RDX_02;
  ulong uVar41;
  WhereTerm *pWVar42;
  Table *pTVar43;
  char **ppcVar44;
  WhereTerm *pWVar45;
  int iVar46;
  ushort uVar47;
  int iVar48;
  ulong uVar49;
  char **ppcVar50;
  int iVar51;
  ulong uVar52;
  long lVar53;
  Parse *pPVar54;
  u8 *puVar55;
  ulong uVar56;
  bool bVar57;
  ushort uVar58;
  bool bVar59;
  Token sCollSeqName;
  Token local_40;
  
  pParse = *(Parse **)pSrc;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pMaskSet = (WhereMaskSet *)pSrc->a[0].pSchema;
  pTVar43 = pSrc->a[0].pTab;
  iVar48 = (int)pWC;
  lVar24 = (long)iVar48;
  lVar25 = lVar24 * 0x38;
  ppcVar44 = &pTVar43->zName + lVar24 * 7;
  pEVar8 = (Expr *)(&pTVar43->zName)[lVar24 * 7];
  pEVar29 = pEVar8->pLeft;
  BVar26 = exprTableUsage(pMaskSet,pEVar29);
  bVar2 = pEVar8->op;
  if (bVar2 == 0x49) {
    ppcVar44[5] = (char *)0x0;
    pcVar27 = (char *)0x0;
  }
  else {
    if (bVar2 == 0x48) {
      if ((pEVar8->flags & 0x800) == 0) {
        pcVar27 = (char *)exprListTableUsage(pMaskSet,(pEVar8->x).pList);
      }
      else {
        pcVar27 = (char *)exprSelectTableUsage(pMaskSet,(Select *)(pEVar8->x).pList);
      }
    }
    else {
      pcVar27 = (char *)exprTableUsage(pMaskSet,pEVar8->pRight);
    }
    ppcVar44[5] = pcVar27;
  }
  pEVar28 = (ExprList *)exprTableUsage(pMaskSet,pEVar8);
  if ((pEVar8->flags & 1) == 0) {
    uVar52 = 0;
  }
  else {
    if ((long)pMaskSet->n < 1) {
      uVar52 = 0;
    }
    else {
      uVar52 = 0;
      lVar53 = 0;
      do {
        if (pMaskSet->ix[lVar53] == (int)pEVar8->iRightJoinTable) {
          uVar52 = 1L << ((byte)lVar53 & 0x3f);
          break;
        }
        lVar53 = lVar53 + 1;
      } while (pMaskSet->n != lVar53);
    }
    pEVar28 = (ExprList *)((ulong)pEVar28 | uVar52);
    uVar52 = uVar52 - 1;
  }
  ppcVar44[6] = (char *)pEVar28;
  ppcVar44[1] = (char *)0xffffffffffffffff;
  *(undefined2 *)(ppcVar44 + 3) = 0;
  if ((bVar2 & 0xfe) == 0x48 || bVar2 - 0x4c < 5) {
    for (; pEVar29 != (Expr *)0x0; pEVar29 = pEVar29->pLeft) {
      if ((pEVar29->op != '\\') && (pEVar29->op != '\x18')) goto LAB_00196c95;
    }
    pEVar29 = (Expr *)0x0;
LAB_00196c95:
    for (pEVar30 = pEVar8->pRight; pEVar30 != (Expr *)0x0; pEVar30 = pEVar30->pLeft) {
      if ((pEVar30->op != '\\') && (pEVar30->op != '\x18')) goto LAB_00196cb8;
    }
    pEVar30 = (Expr *)0x0;
LAB_00196cb8:
    uVar58 = 0x400;
    if ((BVar26 & (ulong)pcVar27) == 0) {
      uVar58 = 0xfff;
    }
    if (pEVar29->op == 0x98) {
      iVar22 = pEVar29->iTable;
      *(int *)((long)ppcVar44 + 0xc) = iVar22;
      *(int *)(ppcVar44 + 2) = (int)pEVar29->iColumn;
      if (bVar2 == 0x48) {
        uVar47 = 1;
      }
      else if (bVar2 == 0x49) {
        uVar47 = 0x80;
      }
      else {
        uVar47 = (ushort)(2 << ((byte)(bVar2 - 0x4c) & 0x1f));
      }
      *(ushort *)(ppcVar44 + 3) = uVar58 & uVar47;
      bVar59 = -1 < iVar22;
    }
    else {
      bVar59 = false;
    }
    if ((pEVar30 != (Expr *)0x0) && (pEVar30->op == 0x98)) {
      if (bVar59) {
        pEVar29 = exprDup(db,pEVar8,0,(u8 **)0x0);
        if (db->mallocFailed != '\0') {
          sqlite3ExprDelete(db,pEVar29);
          return;
        }
        iVar22 = whereClauseInsert((WhereClause *)pSrc,pEVar29,'\x03');
        if (iVar22 == 0) {
          return;
        }
        pTVar43 = pSrc->a[0].pTab;
        *(int *)(&pTVar43->aCol + (long)iVar22 * 7) = iVar48;
        *(undefined1 *)((long)&pTVar43->pSelect + lVar25 + 3) = 1;
        pbVar38 = (byte *)((long)&pTVar43->pSelect + lVar25 + 2);
        *pbVar38 = *pbVar38 | 8;
        ppcVar44 = &pTVar43->zName + (long)iVar22 * 7;
        ppcVar50 = &pTVar43->zName + lVar24 * 7;
        if (pEVar8->op == 'L') {
          if (((pEVar8->flags & 1) == 0) && ((db->dbOptFlags & 0x200) == 0)) {
            *(byte *)((long)ppcVar50 + 0x19) = *(byte *)((long)ppcVar50 + 0x19) | 4;
            sVar18 = 0x400;
          }
          else {
            sVar18 = 0;
          }
        }
        else {
          sVar18 = 0;
        }
      }
      else {
        sVar18 = 0;
        ppcVar50 = ppcVar44;
        pEVar29 = pEVar8;
      }
      pEVar30 = pEVar29->pLeft;
      uVar47 = pEVar29->pRight->flags;
      uVar39 = uVar47 & 0x100;
      if (uVar39 == (pEVar30->flags & 0x100)) {
        if (uVar39 == 0) {
          pCVar31 = sqlite3ExprCollSeq(pParse,pEVar30);
          pEVar30 = pEVar29->pLeft;
          if (pCVar31 != (CollSeq *)0x0) {
            pbVar38 = (byte *)((long)&pEVar30->flags + 1);
            *pbVar38 = *pbVar38 | 1;
          }
        }
        else {
          pEVar29->pRight->flags = uVar47 & 0xfeff;
        }
      }
      pEVar35 = pEVar29->pRight;
      pEVar29->pRight = pEVar30;
      pEVar29->pLeft = pEVar35;
      if (0x4c < pEVar29->op) {
        pEVar29->op = (pEVar29->op + 0xb3 ^ 2) + 0x4d;
      }
      for (; (pEVar35->op == '\\' || (pEVar35->op == '\x18')); pEVar35 = pEVar35->pLeft) {
      }
      *(int *)((long)ppcVar44 + 0xc) = pEVar35->iTable;
      *(int *)(ppcVar44 + 2) = (int)pEVar35->iColumn;
      ppcVar44[5] = (char *)(BVar26 | uVar52);
      ppcVar44[6] = (char *)pEVar28;
      uVar14 = pEVar29->op;
      if (uVar14 == 'H') {
        sVar19 = 1;
      }
      else if (uVar14 == 'I') {
        sVar19 = 0x80;
      }
      else {
        sVar19 = (short)(2 << (uVar14 + 0xb4 & 0x1f));
      }
      *(ushort *)(ppcVar44 + 3) = uVar58 & sVar18 + sVar19;
      ppcVar44 = ppcVar50;
    }
  }
  else {
    if (bVar2 == 0x44) {
      pWC_00 = (WhereClause *)sqlite3DbMallocRaw(db,0x1f8);
      if (pWC_00 == (WhereClause *)0x0) {
        ppcVar44[2] = (char *)0x0;
      }
      else {
        memset(pWC_00,0,0x1f8);
        ppcVar44[2] = (char *)pWC_00;
        *(byte *)((long)ppcVar44 + 0x1a) = *(byte *)((long)ppcVar44 + 0x1a) | 0x10;
        uVar4 = *(u16 *)((long)&pSrc->a[0].zName + 2);
        pWC_00->pParse = *(Parse **)pSrc;
        pWC_00->pMaskSet = pMaskSet;
        pWC_00->pOuter = (WhereClause *)0x0;
        pWC_00->nTerm = 0;
        pWC_00->nSlot = 8;
        pWC_00->a = pWC_00->aStatic;
        pWC_00->wctrlFlags = uVar4;
        whereSplit(pWC_00,pEVar8,0x44);
        if (0 < pWC_00->nTerm) {
          uVar20 = pWC_00->nTerm + 1;
          uVar40 = extraout_RDX;
          do {
            exprAnalyze((SrcList *)pWC_00,(WhereClause *)(ulong)(uVar20 - 2),(int)uVar40);
            uVar20 = uVar20 - 1;
            uVar40 = extraout_RDX_00;
          } while (1 < uVar20);
        }
        if (db->mallocFailed == '\0') {
          iVar22 = pWC_00->nTerm;
          if (iVar22 < 1) {
            pWC_00[1].pParse = (Parse *)0xffffffffffffffff;
            *(undefined2 *)(ppcVar44 + 3) = 0x100;
            uVar56 = 0xffffffffffffffff;
LAB_001973ee:
            pWVar45 = pWC_00->a;
            iVar22 = pWC_00->nTerm;
            iVar21 = 0;
            bVar59 = true;
            iVar51 = -1;
LAB_0019740f:
            pWVar42 = pWVar45;
            puVar55 = &pWVar45->wtFlags;
            iVar46 = iVar22;
            if (0 < iVar22) {
              do {
                pWVar42->wtFlags = pWVar42->wtFlags & 0xbf;
                iVar6 = pWVar42->leftCursor;
                if (iVar6 != iVar51) {
                  if (0 < (long)pMaskSet->n) {
                    lVar53 = 0;
                    do {
                      if (pMaskSet->ix[lVar53] == iVar6) {
                        uVar41 = 1L << ((byte)lVar53 & 0x3f);
                        goto LAB_0019745d;
                      }
                      lVar53 = lVar53 + 1;
                    } while (pMaskSet->n != lVar53);
                  }
                  uVar41 = 0;
LAB_0019745d:
                  if ((uVar41 & uVar56) != 0) goto LAB_00197479;
                }
                bVar57 = iVar46 < 2;
                pWVar42 = pWVar42 + 1;
                puVar55 = puVar55 + 0x38;
                iVar46 = iVar46 + -1;
                if (bVar57) goto LAB_00197531;
              } while( true );
            }
            goto LAB_00197118;
          }
          pWVar45 = pWC_00->a;
          uVar56 = 0xffffffffffffffff;
          pPVar54 = (Parse *)0xffffffffffffffff;
          do {
            bVar2 = (byte)pWVar45->eOperator;
            if (bVar2 == 0) {
              pWC_01 = (WhereOrInfo *)sqlite3DbMallocRaw(db,0x1f0);
              if (pWC_01 == (WhereOrInfo *)0x0) {
                uVar56 = 0;
              }
              else {
                (pWVar45->u).pOrInfo = pWC_01;
                pWVar45->wtFlags = pWVar45->wtFlags | 0x20;
                pWVar45->eOperator = 0x200;
                uVar4 = *(u16 *)((long)&pSrc->a[0].zName + 2);
                (pWC_01->wc).pParse = *(Parse **)pSrc;
                (pWC_01->wc).pMaskSet = pMaskSet;
                (pWC_01->wc).pOuter = (WhereClause *)0x0;
                (pWC_01->wc).nTerm = 0;
                (pWC_01->wc).nSlot = 8;
                (pWC_01->wc).a = (pWC_01->wc).aStatic;
                (pWC_01->wc).wctrlFlags = uVar4;
                whereSplit((WhereClause *)pWC_01,pWVar45->pExpr,0x45);
                iVar51 = (pWC_01->wc).nTerm;
                if (0 < iVar51) {
                  uVar20 = iVar51 + 1;
                  uVar40 = extraout_RDX_01;
                  do {
                    exprAnalyze((SrcList *)pWC_01,(WhereClause *)(ulong)(uVar20 - 2),(int)uVar40);
                    uVar20 = uVar20 - 1;
                    uVar40 = extraout_RDX_02;
                  } while (1 < uVar20);
                }
                (pWC_01->wc).pOuter = (WhereClause *)pSrc;
                if ((db->mallocFailed == '\0') && (iVar51 = (pWC_01->wc).nTerm, 0 < iVar51)) {
                  pWVar42 = (pWC_01->wc).a;
                  uVar56 = 0;
                  iVar21 = 0;
                  do {
                    bVar2 = pWVar42->pExpr->op;
                    if ((bVar2 & 0xfe) == 0x48 || 0xfffffffa < bVar2 - 0x51) {
                      if (0 < (long)pMaskSet->n) {
                        lVar53 = 0;
                        do {
                          if (pMaskSet->ix[lVar53] == pWVar42->leftCursor) {
                            uVar41 = 1L << ((byte)lVar53 & 0x3f);
                            goto LAB_00196fc9;
                          }
                          lVar53 = lVar53 + 1;
                        } while (pMaskSet->n != lVar53);
                      }
                      uVar41 = 0;
LAB_00196fc9:
                      uVar56 = uVar56 | uVar41;
                    }
                    iVar21 = iVar21 + 1;
                    pWVar42 = pWVar42 + 1;
                  } while (iVar21 != iVar51);
                }
                else {
                  uVar56 = 0;
                }
                pPVar54 = (Parse *)((ulong)pPVar54 & uVar56);
                uVar56 = 0;
              }
            }
            else {
              bVar17 = pWVar45->wtFlags;
              if ((bVar17 & 8) == 0) {
                lVar53 = (long)pMaskSet->n;
                if (lVar53 < 1) {
                  uVar41 = 0;
                  uVar49 = 0;
                  if ((bVar17 & 2) != 0) goto LAB_00196fe8;
                }
                else {
                  lVar37 = 0;
                  do {
                    if (pMaskSet->ix[lVar37] == pWVar45->leftCursor) {
                      uVar41 = 1L << ((byte)lVar37 & 0x3f);
                      goto LAB_00196f24;
                    }
                    lVar37 = lVar37 + 1;
                  } while (lVar53 != lVar37);
                  uVar41 = 0;
LAB_00196f24:
                  if ((bVar17 & 2) != 0) {
                    lVar37 = 0;
                    do {
                      if (pMaskSet->ix[lVar37] == pWC_00->a[pWVar45->iParent].leftCursor) {
                        uVar49 = 1L << ((byte)lVar37 & 0x3f);
                        goto LAB_00196fe8;
                      }
                      lVar37 = lVar37 + 1;
                    } while (lVar53 != lVar37);
                    uVar49 = 0;
LAB_00196fe8:
                    uVar41 = uVar41 | uVar49;
                  }
                }
                pPVar54 = (Parse *)((ulong)pPVar54 & uVar41);
                uVar56 = uVar56 & uVar41;
                if ((bVar2 & 2) == 0) {
                  uVar56 = 0;
                }
              }
            }
            if (iVar22 < 2) break;
            iVar22 = iVar22 + -1;
            pWVar45 = pWVar45 + 1;
          } while (pPVar54 != (Parse *)0x0);
          pWC_00[1].pParse = pPVar54;
          *(ushort *)(ppcVar44 + 3) = (ushort)(pPVar54 != (Parse *)0x0) << 8;
          if (uVar56 != 0) goto LAB_001973ee;
        }
      }
      goto LAB_00197118;
    }
    if ((bVar2 == 0x47) && (*(char *)&pSrc->a[0].zName == 'E')) {
      pEVar28 = (pEVar8->x).pList;
      lVar53 = 0;
      bVar59 = true;
      do {
        bVar57 = bVar59;
        bVar2 = "PN"[lVar53];
        pEVar29 = exprDup(db,pEVar8->pLeft,0,(u8 **)0x0);
        pEVar30 = exprDup(db,pEVar28->a[lVar53].pExpr,0,(u8 **)0x0);
        pEVar29 = sqlite3PExpr(pParse,(uint)bVar2,pEVar29,pEVar30,(Token *)0x0);
        uVar20 = whereClauseInsert((WhereClause *)pSrc,pEVar29,'\x03');
        exprAnalyze(pSrc,(WhereClause *)(ulong)uVar20,idxTerm_00);
        pTVar43 = pSrc->a[0].pTab;
        *(int *)(&pTVar43->aCol + (long)(int)uVar20 * 7) = iVar48;
        lVar53 = 1;
        bVar59 = false;
      } while (bVar57);
      *(undefined1 *)((long)&pTVar43->pSelect + lVar25 + 3) = 2;
      ppcVar44 = &pTVar43->zName + lVar24 * 7;
    }
  }
LAB_0019712b:
  if (*(char *)&pSrc->a[0].zName != 'E') goto LAB_001977e5;
  if (pEVar8->op != 0x97) goto LAB_00197927;
  if (((pEVar8->x).pList != (ExprList *)0x0) && (((pEVar8->x).pList)->nExpr == 2)) {
    db_00 = pParse->db;
    pcVar27 = (pEVar8->u).zToken;
    if (pcVar27 == (char *)0x0) {
      uVar20 = 0;
    }
    else {
      uVar20 = 0xffffffff;
      pcVar32 = pcVar27;
      do {
        uVar20 = uVar20 + 1;
        cVar15 = *pcVar32;
        pcVar32 = pcVar32 + 1;
      } while (cVar15 != '\0');
      uVar20 = uVar20 & 0x3fffffff;
    }
    pFVar33 = sqlite3FindFunction(db_00,pcVar27,uVar20,2,'\x01','\0');
    if ((pFVar33 != (FuncDef *)0x0) && (bVar2 = pFVar33->flags, (bVar2 & 1) != 0)) {
      pEVar9 = ((pEVar8->x).pList)->a;
      pEVar29 = pEVar9[1].pExpr;
      if (pEVar29->op == 0x98) {
        pcVar27 = (char *)pFVar33->pUserData;
        cVar15 = *pcVar27;
        cVar16 = pcVar27[1];
        cVar3 = pcVar27[2];
        cVar13 = sqlite3ExprAffinity(pEVar29);
        if ((cVar13 == 'a') && ((pEVar29->pTab->tabFlags & 0x10) == 0)) {
          pEVar29 = pEVar9->pExpr;
          uVar14 = pEVar29->op;
          if (uVar14 == 0x84) {
            uVar14 = pEVar29->op2;
          }
          if (uVar14 == 0x85) {
            sVar18 = pEVar29->iColumn;
            pVal = sqlite3VdbeGetValue(pParse->pReprepare,(int)sVar18,aff);
            if ((pVal == (sqlite3_value *)0x0) || (pVal->type != '\x03')) {
              pcVar27 = (char *)0x0;
            }
            else {
              pcVar27 = (char *)sqlite3ValueText(pVal,'\x01');
            }
            if (sVar18 < 0x21) {
              puVar1 = &pParse->pVdbe->expmask;
              *puVar1 = *puVar1 | 1 << ((char)sVar18 - 1U & 0x1f);
            }
            else {
              pParse->pVdbe->expmask = 0xffffffff;
            }
LAB_001976f4:
            if (pcVar27 != (char *)0x0) {
              lVar53 = -0x200000000;
              uVar56 = 0;
              do {
                uVar41 = uVar56;
                lVar53 = lVar53 + 0x100000000;
                cVar13 = pcVar27[uVar41];
                uVar56 = uVar41 + 1;
                if (((cVar13 == '\0') || (cVar13 == cVar15)) || (cVar13 == cVar16)) break;
              } while (cVar13 != cVar3);
              if ((uVar56 != 1) && (pcVar27[lVar53 >> 0x20] != -1)) {
                bVar59 = false;
                if (cVar13 == cVar15) {
                  bVar59 = pcVar27[uVar56 & 0xffffffff] == '\0';
                }
                pEVar30 = sqlite3Expr(db_00,0x5e,pcVar27);
                if (pEVar30 != (Expr *)0x0) {
                  (pEVar30->u).zToken[uVar41] = '\0';
                }
                if (uVar14 == 0x85) {
                  pVVar10 = pParse->pVdbe;
                  if (pEVar29->iColumn < 0x21) {
                    pVVar10->expmask = pVVar10->expmask | 1 << ((char)pEVar29->iColumn - 1U & 0x1f);
                  }
                  else {
                    pVVar10->expmask = 0xffffffff;
                  }
                  if ((bVar59) && ((pEVar29->u).zToken[1] != '\0')) {
                    if (pParse->nTempReg == '\0') {
                      iVar22 = pParse->nMem + 1;
                      pParse->nMem = iVar22;
                    }
                    else {
                      bVar17 = pParse->nTempReg - 1;
                      pParse->nTempReg = bVar17;
                      iVar22 = pParse->aTempReg[bVar17];
                    }
                    sqlite3ExprCodeTarget(pParse,pEVar29,iVar22);
                    if (pVVar10->nOp != 0) {
                      pVVar10->aOp[pVVar10->nOp - 1].p3 = 0;
                    }
                    if (iVar22 != 0) {
                      bVar17 = pParse->nTempReg;
                      if ((ulong)bVar17 < 8) {
                        lVar53 = 0;
                        do {
                          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar53) == iVar22) {
                            (&pParse->aColCache[0].tempReg)[lVar53] = '\x01';
                            goto LAB_00197a13;
                          }
                          lVar53 = lVar53 + 0x18;
                        } while ((int)lVar53 != 0xf0);
                        pParse->nTempReg = bVar17 + 1;
                        pParse->aTempReg[bVar17] = iVar22;
                      }
                    }
                  }
                }
LAB_00197a13:
                sqlite3ValueFree(pVal);
                pEVar29 = ((pEVar8->x).pList)->a[1].pExpr;
                pEVar35 = exprDup(db,pEVar30,0,(u8 **)0x0);
                if (db->mallocFailed == '\0') {
                  pcVar27 = (pEVar35->u).zToken;
                  if (pcVar27 == (char *)0x0) {
                    uVar56 = 0;
                  }
                  else {
                    lVar53 = -1;
                    do {
                      lVar37 = lVar53 + 1;
                      lVar53 = lVar53 + 1;
                    } while (pcVar27[lVar37] != '\0');
                    uVar56 = (ulong)((uint)lVar53 & 0x3fffffff);
                  }
                  bVar17 = pcVar27[uVar56 - 1];
                  if ((bVar2 & 2) == 0) {
                    if (bVar17 == 0x40) {
                      bVar59 = false;
                    }
                    bVar17 = ""[bVar17];
                  }
                  pcVar27[uVar56 - 1] = bVar17 + 1;
                }
                local_40.z = "BINARY";
                if ((bVar2 & 2) == 0) {
                  local_40.z = "NOCASE";
                }
                local_40.n = 6;
                pEVar36 = exprDup(db,pEVar29,0,(u8 **)0x0);
                pEVar36 = sqlite3ExprAddCollateToken(pParse,pEVar36,&local_40);
                pEVar30 = sqlite3PExpr(pParse,0x50,pEVar36,pEVar30,(Token *)0x0);
                uVar20 = whereClauseInsert((WhereClause *)pSrc,pEVar30,'\x03');
                exprAnalyze(pSrc,(WhereClause *)(ulong)uVar20,idxTerm_02);
                pEVar29 = exprDup(db,pEVar29,0,(u8 **)0x0);
                pEVar29 = sqlite3ExprAddCollateToken(pParse,pEVar29,&local_40);
                pEVar29 = sqlite3PExpr(pParse,0x4f,pEVar29,pEVar35,(Token *)0x0);
                uVar23 = whereClauseInsert((WhereClause *)pSrc,pEVar29,'\x03');
                exprAnalyze(pSrc,(WhereClause *)(ulong)uVar23,idxTerm_03);
                pTVar43 = pSrc->a[0].pTab;
                ppcVar44 = &pTVar43->zName + lVar24 * 7;
                if (bVar59) {
                  *(int *)(&pTVar43->aCol + (long)(int)uVar20 * 7) = iVar48;
                  *(int *)(&pTVar43->aCol + (long)(int)uVar23 * 7) = iVar48;
                  *(undefined1 *)((long)ppcVar44 + 0x1b) = 2;
                }
                goto LAB_001977e5;
              }
            }
          }
          else {
            if (uVar14 == '^') {
              pcVar27 = (pEVar29->u).zToken;
              pVal = (sqlite3_value *)0x0;
              goto LAB_001976f4;
            }
            pVal = (sqlite3_value *)0x0;
          }
          sqlite3ValueFree(pVal);
        }
      }
    }
  }
LAB_001977e5:
  if (pEVar8->op == 0x97) {
    pbVar38 = (byte *)(pEVar8->u).zToken;
    bVar2 = *pbVar38;
    if (bVar2 == 0) {
      pbVar34 = (byte *)0x1a6855;
    }
    else {
      pbVar34 = (byte *)0x1a6855;
      do {
        uVar56 = (ulong)bVar2;
        pbVar38 = pbVar38 + 1;
        if (""[uVar56] != ""[*pbVar34]) goto LAB_00197837;
        pbVar34 = pbVar34 + 1;
        bVar2 = *pbVar38;
      } while (bVar2 != 0);
    }
    uVar56 = 0;
LAB_00197837:
    if ((""[uVar56] == ""[*pbVar34]) && (((pEVar8->x).pList)->nExpr == 2)) {
      pEVar9 = ((pEVar8->x).pList)->a;
      pEVar8 = pEVar9[1].pExpr;
      if (pEVar8->op == 0x98) {
        pEVar29 = pEVar9->pExpr;
        pcVar27 = (char *)exprTableUsage(pMaskSet,pEVar29);
        BVar26 = exprTableUsage(pMaskSet,pEVar8);
        if ((BVar26 & (ulong)pcVar27) == 0) {
          pEVar29 = exprDup(db,pEVar29,0,(u8 **)0x0);
          pEVar29 = sqlite3PExpr(pParse,0x32,(Expr *)0x0,pEVar29,(Token *)0x0);
          iVar22 = whereClauseInsert((WhereClause *)pSrc,pEVar29,'\x03');
          pTVar43 = pSrc->a[0].pTab;
          lVar53 = (long)iVar22;
          (&pTVar43->zColAff)[lVar53 * 7] = pcVar27;
          *(int *)((long)&pTVar43->aCol + lVar53 * 0x38 + 4) = pEVar8->iTable;
          *(int *)(&pTVar43->pIndex + lVar53 * 7) = (int)pEVar8->iColumn;
          *(undefined2 *)(&pTVar43->pSelect + lVar53 * 7) = 0x40;
          *(int *)(&pTVar43->aCol + lVar53 * 7) = iVar48;
          pTVar11 = pSrc->a[0].pTab;
          *(undefined1 *)((long)&pTVar11->pSelect + lVar25 + 3) = 1;
          pbVar38 = (byte *)((long)&pTVar11->pSelect + lVar25 + 2);
          *pbVar38 = *pbVar38 | 8;
          ppcVar44 = &pTVar11->zName + lVar24 * 7;
          (&pTVar43->pCheck)[lVar53 * 7] = (&pTVar11->pCheck)[lVar24 * 7];
        }
      }
    }
  }
LAB_00197927:
  ppcVar44[5] = (char *)((ulong)ppcVar44[5] | uVar52);
  return;
LAB_00197479:
  iVar51 = 0;
  if (0 < iVar46) {
    iVar7 = (pWVar42->u).leftColumn;
    do {
      if (*(int *)(puVar55 + -0xe) == iVar6) {
        bVar57 = false;
        bVar59 = true;
        if (((anon_union_8_3_737c4e49_for_u *)(puVar55 + -10))->leftColumn != iVar7)
        goto LAB_0019750e;
        pEVar29 = ((WhereTerm *)(puVar55 + -0x1a))->pExpr;
        cVar15 = sqlite3ExprAffinity(pEVar29->pRight);
        cVar16 = sqlite3ExprAffinity(pEVar29->pLeft);
        if ((cVar15 != '\0') && (cVar15 != cVar16)) goto LAB_0019750e;
        *puVar55 = *puVar55 | 0x40;
      }
      else {
        *puVar55 = *puVar55 & 0xbf;
      }
      iVar51 = iVar51 + 1;
      puVar55 = puVar55 + 0x38;
    } while (iVar46 != iVar51);
  }
  bVar59 = false;
  bVar57 = true;
LAB_0019750e:
  bVar12 = iVar21 != 0;
  iVar21 = iVar21 + 1;
  iVar51 = iVar6;
  if (bVar57 || bVar12) goto LAB_00197531;
  goto LAB_0019740f;
LAB_00197531:
  if (!bVar59) {
    if (iVar22 < 1) {
      pEVar28 = (ExprList *)0x0;
      pEVar29 = (Expr *)0x0;
    }
    else {
      uVar20 = iVar22 + 1;
      pEVar29 = (Expr *)0x0;
      pEVar28 = (ExprList *)0x0;
      do {
        if ((pWVar45->wtFlags & 0x40) != 0) {
          pEVar29 = exprDup(db,pWVar45->pExpr->pRight,0,(u8 **)0x0);
          pEVar28 = sqlite3ExprListAppend((Parse *)**(undefined8 **)pSrc,pEVar28,pEVar29);
          pEVar29 = pWVar45->pExpr->pLeft;
        }
        pWVar45 = pWVar45 + 1;
        uVar20 = uVar20 - 1;
      } while (1 < uVar20);
    }
    pEVar29 = exprDup(db,pEVar29,0,(u8 **)0x0);
    pEVar29 = sqlite3PExpr(pParse,0x48,pEVar29,(Expr *)0x0,(Token *)0x0);
    if (pEVar29 == (Expr *)0x0) {
      sqlite3ExprListDelete(db,pEVar28);
    }
    else {
      iVar5 = pEVar8->iRightJoinTable;
      pEVar29->flags = pEVar29->flags | pEVar8->flags & 1;
      pEVar29->iRightJoinTable = iVar5;
      (pEVar29->x).pList = pEVar28;
      uVar20 = whereClauseInsert((WhereClause *)pSrc,pEVar29,'\x03');
      exprAnalyze(pSrc,(WhereClause *)(ulong)uVar20,idxTerm_01);
      pTVar43 = pSrc->a[0].pTab;
      *(int *)(&pTVar43->aCol + (long)(int)uVar20 * 7) = iVar48;
      *(undefined1 *)((long)&pTVar43->pSelect + lVar25 + 3) = 1;
    }
    *(undefined2 *)(&pTVar43->pSelect + lVar24 * 7) = 0x800;
  }
LAB_00197118:
  ppcVar44 = &(pSrc->a[0].pTab)->zName + lVar24 * 7;
  goto LAB_0019712b;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* LIKE/GLOB distinguishes case */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWC->pParse;     /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = pWC->pMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = exprTableUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectTableUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = exprListTableUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = exprTableUsage(pMaskSet, pExpr->pRight);
  }
  prereqAll = exprTableUsage(pMaskSet, pExpr);
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = getMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;
    if( pLeft->op==TK_COLUMN ){
      pTerm->leftCursor = pLeft->iTable;
      pTerm->u.leftColumn = pLeft->iColumn;
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( pRight && pRight->op==TK_COLUMN ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        pNew->iParent = idxTerm;
        pTerm = &pWC->a[idxTerm];
        pTerm->nChild = 1;
        pTerm->wtFlags |= TERM_COPIED;
        if( pExpr->op==TK_EQ
         && !ExprHasProperty(pExpr, EP_FromJoin)
         && OptimizationEnabled(db, SQLITE_Transitive)
        ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pLeft = sqlite3ExprSkipCollate(pDup->pLeft);
      pNew->leftCursor = pLeft->iTable;
      pNew->u.leftColumn = pLeft->iColumn;
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      pWC->a[idxNew].iParent = idxTerm;
    }
    pTerm->nChild = 2;
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'abc%'" is changed into constraints
  **
  **          x>='abc' AND x<'abd' AND x LIKE 'abc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    Token sCollSeqName;  /* Name of collating sequence */

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);
    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;   /* EV: R-64339-08207 */


        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    sCollSeqName.z = noCase ? "NOCASE" : "BINARY";
    sCollSeqName.n = 6;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE, 
           sqlite3ExprAddCollateToken(pParse,pNewExpr1,&sCollSeqName),
           pStr1, 0);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateToken(pParse,pNewExpr2,&sCollSeqName),
           pStr2, 0);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      pWC->a[idxNew1].iParent = idxTerm;
      pWC->a[idxNew2].iParent = idxTerm;
      pTerm->nChild = 2;
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_MATCH auxiliary term to the constraint set if the
  ** current expression is of the form:  column MATCH expr.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( isMatchOfColumn(pExpr) ){
    int idxNew;
    Expr *pRight, *pLeft;
    WhereTerm *pNewTerm;
    Bitmask prereqColumn, prereqExpr;

    pRight = pExpr->x.pList->a[0].pExpr;
    pLeft = pExpr->x.pList->a[1].pExpr;
    prereqExpr = exprTableUsage(pMaskSet, pRight);
    prereqColumn = exprTableUsage(pMaskSet, pLeft);
    if( (prereqExpr & prereqColumn)==0 ){
      Expr *pNewExpr;
      pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
                              0, sqlite3ExprDup(db, pRight, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = prereqExpr;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_MATCH;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

#ifdef SQLITE_ENABLE_STAT3
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.  This
  ** TERM_VNULL tag will suppress the not-null check at the beginning
  ** of the loop.  Without the TERM_VNULL flag, the not-null check at
  ** the start of the loop will prevent any results from being returned.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3PExpr(pParse, TK_NULL, 0, 0, 0), 0);

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  pTerm->prereqRight |= extraRight;
}